

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
booster::locale::details::format_parser::set_flag_with_str<char>
          (format_parser *this,string *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  bool bVar1;
  tm *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *__format;
  ios_info *in_RSI;
  char *__maxsize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffffd8;
  
  __maxsize = "ftime";
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffd8);
  __format = extraout_RDX;
  if (!bVar1) {
    __maxsize = "strftime";
    bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffd8);
    __format = extraout_RDX_00;
    if (!bVar1) {
      return;
    }
  }
  as::strftime(*(char **)in_RDI,(size_t)__maxsize,__format,in_RCX);
  booster::locale::ios_info::get(*(ios_base **)in_RDI);
  ios_info::date_time_pattern<char>(in_RSI,in_RDX);
  return;
}

Assistant:

void set_flag_with_str(std::string const &key,std::basic_string<CharType> const &value)
                {
                    if(key=="ftime" || key=="strftime") {
                        as::strftime(ios_);
                        ios_info::get(ios_).date_time_pattern(value);
                    }
                }